

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 uVar2;
  uint uVar3;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  size_t k;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined8 uVar21;
  undefined8 uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  undefined4 uVar27;
  long lVar28;
  uint uVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  ulong uVar31;
  ulong uVar32;
  NodeRef *pNVar33;
  bool bVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar53;
  float fVar55;
  float fVar56;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar51;
  float fVar52;
  float fVar54;
  undefined1 in_ZMM0 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar97;
  float fVar98;
  undefined1 auVar73 [16];
  float fVar100;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar99;
  float fVar101;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar120;
  float fVar121;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar122;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar123;
  float fVar124;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar137;
  float fVar149;
  float fVar150;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar151;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar170;
  float fVar173;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar177;
  undefined1 auVar167 [16];
  float fVar174;
  float fVar178;
  undefined1 auVar168 [16];
  float fVar171;
  float fVar172;
  float fVar175;
  float fVar176;
  float fVar179;
  undefined1 auVar169 [16];
  float fVar180;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar194;
  float fVar195;
  undefined1 auVar196 [16];
  float fVar209;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar204;
  float fVar207;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar203;
  float fVar205;
  float fVar206;
  float fVar208;
  float fVar210;
  undefined1 auVar202 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [64];
  float fVar217;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar221 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar225 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar226;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar230;
  undefined1 auVar229 [64];
  float fVar231;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar232 [16];
  float fVar238;
  Precalculations pre;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  undefined1 local_1a78 [16];
  float local_1a48;
  float fStack_1a44;
  float fStack_1a40;
  undefined1 local_1a38 [16];
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_19d8 [16];
  undefined1 local_19c8 [16];
  undefined1 local_1998 [16];
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  RTCHitN local_18c8 [16];
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  uint local_1858;
  uint uStack_1854;
  uint uStack_1850;
  uint uStack_184c;
  uint uStack_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar10 = mm_lookupmask_ps._240_16_;
  uVar22 = mm_lookupmask_ps._8_8_;
  uVar21 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar96 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar50 = vpcmpeqd_avx(auVar96,(undefined1  [16])valid_i->field_0);
    auVar59 = ZEXT816(0) << 0x40;
    auVar72 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar59,5);
    auVar71 = auVar50 & auVar72;
    if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar71[0xf] < '\0')
    {
      auVar72 = vandps_avx(auVar72,auVar50);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar87._8_4_ = 0x7fffffff;
      auVar87._0_8_ = 0x7fffffff7fffffff;
      auVar87._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar87,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar79._8_4_ = 0x219392ef;
      auVar79._0_8_ = 0x219392ef219392ef;
      auVar79._12_4_ = 0x219392ef;
      auVar71 = vcmpps_avx(auVar50,auVar79,1);
      auVar211._8_4_ = 0x3f800000;
      auVar211._0_8_ = &DAT_3f8000003f800000;
      auVar211._12_4_ = 0x3f800000;
      auVar78 = vdivps_avx(auVar211,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar50 = vandps_avx(auVar87,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar86 = vcmpps_avx(auVar50,auVar79,1);
      auVar152 = vdivps_avx(auVar211,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar50 = vandps_avx(auVar87,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar79,1);
      auVar228._8_4_ = 0x5d5e0b6b;
      auVar228._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar228._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar78,auVar228,auVar71);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar152,auVar228,auVar86)
      ;
      auVar71 = vdivps_avx(auVar211,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar71,auVar228,auVar50);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar59,1);
      auVar78._8_4_ = 0x10;
      auVar78._0_8_ = 0x1000000010;
      auVar78._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar50,auVar78);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar59,5);
      auVar71._8_4_ = 0x20;
      auVar71._0_8_ = 0x2000000020;
      auVar71._12_4_ = 0x20;
      auVar152._8_4_ = 0x30;
      auVar152._0_8_ = 0x3000000030;
      auVar152._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar152,auVar71,auVar50)
      ;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar59,5);
      auVar86._8_4_ = 0x40;
      auVar86._0_8_ = 0x4000000040;
      auVar86._12_4_ = 0x40;
      auVar153._8_4_ = 0x50;
      auVar153._0_8_ = 0x5000000050;
      auVar153._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar153,auVar86,auVar50)
      ;
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar59);
      auVar71 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar59);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar216 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar50,auVar72);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar71,auVar72);
      terminated.field_0.i[1] = auVar72._4_4_ ^ auVar96._4_4_;
      terminated.field_0.i[0] = auVar72._0_4_ ^ auVar96._0_4_;
      terminated.field_0.i[2] = auVar72._8_4_ ^ auVar96._8_4_;
      terminated.field_0.i[3] = auVar72._12_4_ ^ auVar96._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 3;
      }
      else {
        uVar29 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar30 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar96 = vpcmpeqd_avx(in_ZMM13._0_16_,in_ZMM13._0_16_);
      auVar225 = ZEXT1664(auVar96);
LAB_00324e1a:
      paVar30 = paVar30 + -1;
      root.ptr = pNVar33[-1].ptr;
      pNVar33 = pNVar33 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_003260d9;
      aVar226 = *paVar30;
      auVar96 = vcmpps_avx((undefined1  [16])aVar226,(undefined1  [16])tray.tfar.field_0,1);
      uVar23 = vmovmskps_avx(auVar96);
      if (uVar23 == 0) {
        iVar24 = 2;
      }
      else {
        uVar32 = (ulong)(uVar23 & 0xff);
        uVar23 = POPCOUNT(uVar23 & 0xff);
        iVar24 = 0;
        if (uVar23 <= uVar29) {
          do {
            k = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar225 = ZEXT1664(auVar225._0_16_);
            bVar34 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar34) {
              terminated.field_0.i[k] = -1;
            }
            uVar32 = uVar32 & uVar32 - 1;
          } while (uVar32 != 0);
          auVar96 = vpcmpeqd_avx(auVar225._0_16_,auVar225._0_16_);
          auVar225 = ZEXT1664(auVar96);
          auVar96 = auVar96 & ~(undefined1  [16])terminated.field_0;
          iVar24 = 3;
          auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar96[0xf] < '\0') {
            auVar96._8_4_ = 0xff800000;
            auVar96._0_8_ = 0xff800000ff800000;
            auVar96._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar96,
                               (undefined1  [16])terminated.field_0);
            iVar24 = 2;
          }
        }
        if (uVar29 < uVar23) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_003260d9;
              auVar96 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar226,6);
              if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar96[0xf] < '\0') {
                uVar32 = (ulong)((uint)root.ptr & 0xf);
                aVar51 = terminated.field_0;
                if (uVar32 == 8) goto LAB_00326096;
                lVar28 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar26 = 0;
                auVar96 = auVar225._0_16_ ^ (undefined1  [16])terminated.field_0;
                goto LAB_00325055;
              }
              iVar24 = 2;
              break;
            }
            auVar229 = ZEXT1664(auVar216._0_16_);
            uVar32 = 0;
            uVar26 = 8;
            do {
              uVar31 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar32 * 8);
              if (uVar31 != 8) {
                uVar27 = *(undefined4 *)(root.ptr + 0x20 + uVar32 * 4);
                auVar36._4_4_ = uVar27;
                auVar36._0_4_ = uVar27;
                auVar36._8_4_ = uVar27;
                auVar36._12_4_ = uVar27;
                auVar14._8_8_ = tray.org.field_0._8_8_;
                auVar14._0_8_ = tray.org.field_0._0_8_;
                auVar15._8_8_ = tray.org.field_0._24_8_;
                auVar15._0_8_ = tray.org.field_0._16_8_;
                auVar16._8_8_ = tray.org.field_0._40_8_;
                auVar16._0_8_ = tray.org.field_0._32_8_;
                auVar96 = vsubps_avx(auVar36,auVar14);
                auVar138._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar96._0_4_;
                auVar138._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar96._4_4_;
                auVar138._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar96._8_4_;
                auVar138._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar96._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x40 + uVar32 * 4);
                auVar37._4_4_ = uVar27;
                auVar37._0_4_ = uVar27;
                auVar37._8_4_ = uVar27;
                auVar37._12_4_ = uVar27;
                auVar96 = vsubps_avx(auVar37,auVar15);
                auVar165._0_4_ = tray.rdir.field_0._16_4_ * auVar96._0_4_;
                auVar165._4_4_ = tray.rdir.field_0._20_4_ * auVar96._4_4_;
                auVar165._8_4_ = tray.rdir.field_0._24_4_ * auVar96._8_4_;
                auVar165._12_4_ = tray.rdir.field_0._28_4_ * auVar96._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x60 + uVar32 * 4);
                auVar38._4_4_ = uVar27;
                auVar38._0_4_ = uVar27;
                auVar38._8_4_ = uVar27;
                auVar38._12_4_ = uVar27;
                auVar96 = vsubps_avx(auVar38,auVar16);
                auVar190._0_4_ = tray.rdir.field_0._32_4_ * auVar96._0_4_;
                auVar190._4_4_ = tray.rdir.field_0._36_4_ * auVar96._4_4_;
                auVar190._8_4_ = tray.rdir.field_0._40_4_ * auVar96._8_4_;
                auVar190._12_4_ = tray.rdir.field_0._44_4_ * auVar96._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x30 + uVar32 * 4);
                auVar39._4_4_ = uVar27;
                auVar39._0_4_ = uVar27;
                auVar39._8_4_ = uVar27;
                auVar39._12_4_ = uVar27;
                auVar96 = vsubps_avx(auVar39,auVar14);
                auVar57._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar96._0_4_;
                auVar57._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar96._4_4_;
                auVar57._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar96._8_4_;
                auVar57._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar96._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x50 + uVar32 * 4);
                auVar40._4_4_ = uVar27;
                auVar40._0_4_ = uVar27;
                auVar40._8_4_ = uVar27;
                auVar40._12_4_ = uVar27;
                auVar96 = vsubps_avx(auVar40,auVar15);
                auVar73._0_4_ = tray.rdir.field_0._16_4_ * auVar96._0_4_;
                auVar73._4_4_ = tray.rdir.field_0._20_4_ * auVar96._4_4_;
                auVar73._8_4_ = tray.rdir.field_0._24_4_ * auVar96._8_4_;
                auVar73._12_4_ = tray.rdir.field_0._28_4_ * auVar96._12_4_;
                uVar27 = *(undefined4 *)(root.ptr + 0x70 + uVar32 * 4);
                auVar41._4_4_ = uVar27;
                auVar41._0_4_ = uVar27;
                auVar41._8_4_ = uVar27;
                auVar41._12_4_ = uVar27;
                auVar96 = vsubps_avx(auVar41,auVar16);
                auVar105._0_4_ = tray.rdir.field_0._32_4_ * auVar96._0_4_;
                auVar105._4_4_ = tray.rdir.field_0._36_4_ * auVar96._4_4_;
                auVar105._8_4_ = tray.rdir.field_0._40_4_ * auVar96._8_4_;
                auVar105._12_4_ = tray.rdir.field_0._44_4_ * auVar96._12_4_;
                auVar96 = vminps_avx(auVar138,auVar57);
                auVar50 = vminps_avx(auVar165,auVar73);
                auVar96 = vmaxps_avx(auVar96,auVar50);
                auVar50 = vminps_avx(auVar190,auVar105);
                auVar96 = vmaxps_avx(auVar96,auVar50);
                auVar42._0_4_ = auVar202._0_4_ * auVar96._0_4_;
                auVar42._4_4_ = auVar202._4_4_ * auVar96._4_4_;
                auVar42._8_4_ = auVar202._8_4_ * auVar96._8_4_;
                auVar42._12_4_ = auVar202._12_4_ * auVar96._12_4_;
                auVar96 = vmaxps_avx(auVar138,auVar57);
                auVar50 = vmaxps_avx(auVar165,auVar73);
                auVar50 = vminps_avx(auVar96,auVar50);
                auVar96 = vmaxps_avx(auVar190,auVar105);
                auVar96 = vminps_avx(auVar50,auVar96);
                auVar58._0_4_ = auVar221._0_4_ * auVar96._0_4_;
                auVar58._4_4_ = auVar221._4_4_ * auVar96._4_4_;
                auVar58._8_4_ = auVar221._8_4_ * auVar96._8_4_;
                auVar58._12_4_ = auVar221._12_4_ * auVar96._12_4_;
                auVar96 = vmaxps_avx(auVar42,(undefined1  [16])tray.tnear.field_0);
                auVar50 = vminps_avx(auVar58,(undefined1  [16])tray.tfar.field_0);
                auVar96 = vcmpps_avx(auVar96,auVar50,2);
                if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar96[0xf] < '\0') {
                  auVar96 = vblendvps_avx(auVar216._0_16_,auVar42,auVar96);
                  if (uVar26 != 8) {
                    pNVar33->ptr = uVar26;
                    pNVar33 = pNVar33 + 1;
                    *paVar30 = auVar229._0_16_;
                    paVar30 = paVar30 + 1;
                  }
                  auVar229 = ZEXT1664(auVar96);
                  uVar26 = uVar31;
                }
              }
              aVar226 = auVar229._0_16_;
            } while ((uVar31 != 8) && (bVar34 = uVar32 < 3, uVar32 = uVar32 + 1, bVar34));
            iVar24 = 0;
            if (uVar26 == 8) {
LAB_00324ffc:
              bVar34 = false;
              iVar24 = 4;
            }
            else {
              auVar96 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar226,6);
              uVar27 = vmovmskps_avx(auVar96);
              bVar34 = true;
              if ((uint)POPCOUNT(uVar27) <= uVar29) {
                pNVar33->ptr = uVar26;
                pNVar33 = pNVar33 + 1;
                *paVar30 = aVar226;
                paVar30 = paVar30 + 1;
                goto LAB_00324ffc;
              }
            }
            root.ptr = uVar26;
          } while (bVar34);
        }
      }
      goto LAB_003260dc;
    }
  }
  return;
  while( true ) {
    uVar26 = uVar26 + 1;
    lVar28 = lVar28 + 0xe0;
    auVar96 = auVar50;
    if (uVar32 - 8 <= uVar26) break;
LAB_00325055:
    lVar25 = uVar26 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar31 = 0;
    local_1a78 = auVar96;
    while( true ) {
      uVar23 = *(uint *)(lVar28 + uVar31 * 4);
      if ((ulong)uVar23 == 0xffffffff) break;
      uVar27 = *(undefined4 *)(lVar28 + -0xc0 + uVar31 * 4);
      auVar227._4_4_ = uVar27;
      auVar227._0_4_ = uVar27;
      auVar227._8_4_ = uVar27;
      auVar227._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar28 + -0xb0 + uVar31 * 4);
      auVar191._4_4_ = uVar27;
      auVar191._0_4_ = uVar27;
      auVar191._8_4_ = uVar27;
      auVar191._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar28 + -0xa0 + uVar31 * 4);
      auVar106._4_4_ = uVar27;
      auVar106._0_4_ = uVar27;
      auVar106._8_4_ = uVar27;
      auVar106._12_4_ = uVar27;
      uVar27 = *(undefined4 *)(lVar28 + -0x90 + uVar31 * 4);
      local_19c8._4_4_ = *(undefined4 *)(lVar28 + -0x80 + uVar31 * 4);
      local_19c8._0_4_ = local_19c8._4_4_;
      local_19c8._8_4_ = local_19c8._4_4_;
      local_19c8._12_4_ = local_19c8._4_4_;
      local_19d8._4_4_ = *(undefined4 *)(lVar28 + -0x70 + uVar31 * 4);
      local_19d8._0_4_ = local_19d8._4_4_;
      local_19d8._8_4_ = local_19d8._4_4_;
      local_19d8._12_4_ = local_19d8._4_4_;
      local_1978._4_4_ = *(undefined4 *)(lVar28 + -0x60 + uVar31 * 4);
      local_1978._0_4_ = local_1978._4_4_;
      local_1978._8_4_ = local_1978._4_4_;
      local_1978._12_4_ = local_1978._4_4_;
      local_1988._4_4_ = *(undefined4 *)(lVar28 + -0x50 + uVar31 * 4);
      local_1988._0_4_ = local_1988._4_4_;
      local_1988._8_4_ = local_1988._4_4_;
      local_1988._12_4_ = local_1988._4_4_;
      local_1998._4_4_ = *(undefined4 *)(lVar28 + -0x40 + uVar31 * 4);
      local_1998._0_4_ = local_1998._4_4_;
      local_1998._8_4_ = local_1998._4_4_;
      local_1998._12_4_ = local_1998._4_4_;
      uVar2 = *(undefined4 *)(lVar28 + -0x30 + uVar31 * 4);
      auVar218._4_4_ = uVar2;
      auVar218._0_4_ = uVar2;
      auVar218._8_4_ = uVar2;
      auVar218._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar28 + -0x20 + uVar31 * 4);
      auVar139._4_4_ = uVar2;
      auVar139._0_4_ = uVar2;
      auVar139._8_4_ = uVar2;
      auVar139._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar28 + -0x10 + uVar31 * 4);
      auVar166._4_4_ = uVar2;
      auVar166._0_4_ = uVar2;
      auVar166._8_4_ = uVar2;
      auVar166._12_4_ = uVar2;
      local_18d8 = *(undefined8 *)(lVar25 + 0xd0);
      uStack_18d0 = *(undefined8 *)(lVar25 + 0xd8);
      auVar50 = *(undefined1 (*) [16])(ray + 0x10);
      auVar71 = *(undefined1 (*) [16])(ray + 0x20);
      auVar86 = vsubps_avx(auVar191,auVar50);
      auVar78 = vsubps_avx(auVar106,auVar71);
      auVar152 = vsubps_avx(auVar139,auVar50);
      auVar153 = vsubps_avx(auVar166,auVar71);
      auVar59 = vsubps_avx(auVar152,auVar86);
      auVar87 = vsubps_avx(auVar153,auVar78);
      fVar6 = auVar86._0_4_;
      fVar162 = auVar152._0_4_ + fVar6;
      fVar8 = auVar86._4_4_;
      fVar170 = auVar152._4_4_ + fVar8;
      fVar56 = auVar86._8_4_;
      fVar173 = auVar152._8_4_ + fVar56;
      fVar103 = auVar86._12_4_;
      fVar177 = auVar152._12_4_ + fVar103;
      fVar7 = auVar78._0_4_;
      fVar180 = auVar153._0_4_ + fVar7;
      fVar53 = auVar78._4_4_;
      fVar187 = auVar153._4_4_ + fVar53;
      fVar9 = auVar78._8_4_;
      fVar188 = auVar153._8_4_ + fVar9;
      fVar54 = auVar78._12_4_;
      fVar189 = auVar153._12_4_ + fVar54;
      fVar35 = auVar87._0_4_;
      auVar140._0_4_ = fVar162 * fVar35;
      fVar55 = auVar87._4_4_;
      auVar140._4_4_ = fVar170 * fVar55;
      fVar174 = auVar87._8_4_;
      auVar140._8_4_ = fVar173 * fVar174;
      fVar204 = auVar87._12_4_;
      auVar140._12_4_ = fVar177 * fVar204;
      fVar52 = auVar59._0_4_;
      auVar196._0_4_ = fVar180 * fVar52;
      fVar163 = auVar59._4_4_;
      auVar196._4_4_ = fVar187 * fVar163;
      fVar178 = auVar59._8_4_;
      auVar196._8_4_ = fVar188 * fVar178;
      fVar207 = auVar59._12_4_;
      auVar196._12_4_ = fVar189 * fVar207;
      auVar87 = vsubps_avx(auVar196,auVar140);
      auVar59 = *(undefined1 (*) [16])ray;
      auVar79 = vsubps_avx(auVar227,auVar59);
      auVar228 = vsubps_avx(auVar218,auVar59);
      auVar211 = vsubps_avx(auVar228,auVar79);
      fVar164 = auVar211._0_4_;
      auVar181._0_4_ = fVar164 * fVar180;
      fVar171 = auVar211._4_4_;
      auVar181._4_4_ = fVar171 * fVar187;
      fVar172 = auVar211._8_4_;
      auVar181._8_4_ = fVar172 * fVar188;
      fVar175 = auVar211._12_4_;
      auVar181._12_4_ = fVar175 * fVar189;
      fVar180 = auVar79._0_4_;
      fVar194 = auVar228._0_4_ + fVar180;
      fVar187 = auVar79._4_4_;
      fVar203 = auVar228._4_4_ + fVar187;
      fVar188 = auVar79._8_4_;
      fVar206 = auVar228._8_4_ + fVar188;
      fVar189 = auVar79._12_4_;
      fVar209 = auVar228._12_4_ + fVar189;
      auVar219._0_4_ = fVar194 * fVar35;
      auVar219._4_4_ = fVar203 * fVar55;
      auVar219._8_4_ = fVar206 * fVar174;
      auVar219._12_4_ = fVar209 * fVar204;
      auVar211 = vsubps_avx(auVar219,auVar181);
      auVar182._0_4_ = fVar194 * fVar52;
      auVar182._4_4_ = fVar203 * fVar163;
      auVar182._8_4_ = fVar206 * fVar178;
      auVar182._12_4_ = fVar209 * fVar207;
      auVar167._0_4_ = fVar164 * fVar162;
      auVar167._4_4_ = fVar171 * fVar170;
      auVar167._8_4_ = fVar172 * fVar173;
      auVar167._12_4_ = fVar175 * fVar177;
      auVar11 = vsubps_avx(auVar167,auVar182);
      fVar194 = *(float *)(ray + 0x60);
      auVar18 = *(undefined1 (*) [12])(ray + 0x60);
      fVar203 = *(float *)(ray + 0x6c);
      fVar206 = *(float *)(ray + 0x50);
      fVar209 = *(float *)(ray + 0x54);
      fVar99 = *(float *)(ray + 0x58);
      auVar20 = *(undefined1 (*) [12])(ray + 0x50);
      fVar101 = *(float *)(ray + 0x5c);
      auVar19 = *(undefined1 (*) [12])(ray + 0x40);
      fVar104 = *(float *)(ray + 0x4c);
      auVar220._0_4_ =
           auVar87._0_4_ * *(float *)(ray + 0x40) +
           fVar206 * auVar211._0_4_ + fVar194 * auVar11._0_4_;
      auVar220._4_4_ =
           auVar87._4_4_ * *(float *)(ray + 0x44) +
           fVar209 * auVar211._4_4_ + *(float *)(ray + 100) * auVar11._4_4_;
      auVar220._8_4_ =
           auVar87._8_4_ * *(float *)(ray + 0x48) +
           fVar99 * auVar211._8_4_ + *(float *)(ray + 0x68) * auVar11._8_4_;
      auVar220._12_4_ =
           auVar87._12_4_ * fVar104 + fVar101 * auVar211._12_4_ + fVar203 * auVar11._12_4_;
      auVar50 = vsubps_avx(local_19c8,auVar50);
      auVar71 = vsubps_avx(local_19d8,auVar71);
      auVar86 = vsubps_avx(auVar86,auVar50);
      auVar78 = vsubps_avx(auVar78,auVar71);
      fVar123 = fVar6 + auVar50._0_4_;
      fVar134 = fVar8 + auVar50._4_4_;
      fVar135 = fVar56 + auVar50._8_4_;
      fVar136 = fVar103 + auVar50._12_4_;
      fVar102 = fVar7 + auVar71._0_4_;
      fVar120 = fVar53 + auVar71._4_4_;
      fVar121 = fVar9 + auVar71._8_4_;
      fVar122 = fVar54 + auVar71._12_4_;
      fVar162 = auVar78._0_4_;
      auVar154._0_4_ = fVar123 * fVar162;
      fVar170 = auVar78._4_4_;
      auVar154._4_4_ = fVar134 * fVar170;
      fVar173 = auVar78._8_4_;
      auVar154._8_4_ = fVar135 * fVar173;
      fVar177 = auVar78._12_4_;
      auVar154._12_4_ = fVar136 * fVar177;
      fVar208 = auVar86._0_4_;
      auVar183._0_4_ = fVar208 * fVar102;
      fVar210 = auVar86._4_4_;
      auVar183._4_4_ = fVar210 * fVar120;
      fVar217 = auVar86._8_4_;
      auVar183._8_4_ = fVar217 * fVar121;
      fVar222 = auVar86._12_4_;
      auVar183._12_4_ = fVar222 * fVar122;
      auVar78 = vsubps_avx(auVar183,auVar154);
      auVar11._4_4_ = uVar27;
      auVar11._0_4_ = uVar27;
      auVar11._8_4_ = uVar27;
      auVar11._12_4_ = uVar27;
      auVar59 = vsubps_avx(auVar11,auVar59);
      auVar87 = vsubps_avx(auVar79,auVar59);
      fVar231 = auVar87._0_4_;
      auVar107._0_4_ = fVar231 * fVar102;
      fVar233 = auVar87._4_4_;
      auVar107._4_4_ = fVar233 * fVar120;
      fVar234 = auVar87._8_4_;
      auVar107._8_4_ = fVar234 * fVar121;
      fVar235 = auVar87._12_4_;
      auVar107._12_4_ = fVar235 * fVar122;
      fVar102 = auVar59._0_4_ + fVar180;
      fVar120 = auVar59._4_4_ + fVar187;
      fVar121 = auVar59._8_4_ + fVar188;
      fVar122 = auVar59._12_4_ + fVar189;
      auVar197._0_4_ = fVar102 * fVar162;
      auVar197._4_4_ = fVar120 * fVar170;
      auVar197._8_4_ = fVar121 * fVar173;
      auVar197._12_4_ = fVar122 * fVar177;
      auVar87 = vsubps_avx(auVar197,auVar107);
      auVar198._0_4_ = fVar102 * fVar208;
      auVar198._4_4_ = fVar120 * fVar210;
      auVar198._8_4_ = fVar121 * fVar217;
      auVar198._12_4_ = fVar122 * fVar222;
      auVar43._0_4_ = fVar231 * fVar123;
      auVar43._4_4_ = fVar233 * fVar134;
      auVar43._8_4_ = fVar234 * fVar135;
      auVar43._12_4_ = fVar235 * fVar136;
      auVar79 = vsubps_avx(auVar43,auVar198);
      fVar223 = auVar19._0_4_;
      fVar224 = auVar19._4_4_;
      fVar230 = auVar19._8_4_;
      auVar212._0_4_ = fVar223 * auVar78._0_4_ + fVar194 * auVar79._0_4_ + fVar206 * auVar87._0_4_;
      auVar212._4_4_ =
           fVar224 * auVar78._4_4_ + *(float *)(ray + 100) * auVar79._4_4_ + fVar209 * auVar87._4_4_
      ;
      auVar212._8_4_ =
           fVar230 * auVar78._8_4_ + *(float *)(ray + 0x68) * auVar79._8_4_ + fVar99 * auVar87._8_4_
      ;
      auVar212._12_4_ =
           fVar104 * auVar78._12_4_ + fVar203 * auVar79._12_4_ + fVar101 * auVar87._12_4_;
      auVar78 = vsubps_avx(auVar59,auVar228);
      fVar137 = auVar59._0_4_ + auVar228._0_4_;
      fVar149 = auVar59._4_4_ + auVar228._4_4_;
      fVar150 = auVar59._8_4_ + auVar228._8_4_;
      fVar151 = auVar59._12_4_ + auVar228._12_4_;
      auVar59 = vsubps_avx(auVar50,auVar152);
      fVar122 = auVar50._0_4_ + auVar152._0_4_;
      fVar123 = auVar50._4_4_ + auVar152._4_4_;
      fVar134 = auVar50._8_4_ + auVar152._8_4_;
      fVar135 = auVar50._12_4_ + auVar152._12_4_;
      auVar50 = vsubps_avx(auVar71,auVar153);
      fVar136 = auVar71._0_4_ + auVar153._0_4_;
      fVar97 = auVar71._4_4_ + auVar153._4_4_;
      fVar98 = auVar71._8_4_ + auVar153._8_4_;
      fVar100 = auVar71._12_4_ + auVar153._12_4_;
      fVar176 = auVar50._0_4_;
      auVar155._0_4_ = fVar176 * fVar122;
      fVar179 = auVar50._4_4_;
      auVar155._4_4_ = fVar179 * fVar123;
      fVar195 = auVar50._8_4_;
      auVar155._8_4_ = fVar195 * fVar134;
      fVar205 = auVar50._12_4_;
      auVar155._12_4_ = fVar205 * fVar135;
      fVar194 = auVar59._0_4_;
      auVar184._0_4_ = fVar194 * fVar136;
      fVar102 = auVar59._4_4_;
      auVar184._4_4_ = fVar102 * fVar97;
      fVar120 = auVar59._8_4_;
      auVar184._8_4_ = fVar120 * fVar98;
      fVar121 = auVar59._12_4_;
      auVar184._12_4_ = fVar121 * fVar100;
      auVar50 = vsubps_avx(auVar184,auVar155);
      fVar124 = auVar78._0_4_;
      auVar74._0_4_ = fVar124 * fVar136;
      fVar136 = auVar78._4_4_;
      auVar74._4_4_ = fVar136 * fVar97;
      fVar97 = auVar78._8_4_;
      auVar74._8_4_ = fVar97 * fVar98;
      fVar98 = auVar78._12_4_;
      auVar74._12_4_ = fVar98 * fVar100;
      auVar185._0_4_ = fVar176 * fVar137;
      auVar185._4_4_ = fVar179 * fVar149;
      auVar185._8_4_ = fVar195 * fVar150;
      auVar185._12_4_ = fVar205 * fVar151;
      auVar71 = vsubps_avx(auVar185,auVar74);
      auVar141._0_4_ = fVar137 * fVar194;
      auVar141._4_4_ = fVar149 * fVar102;
      auVar141._8_4_ = fVar150 * fVar120;
      auVar141._12_4_ = fVar151 * fVar121;
      auVar59._0_4_ = fVar124 * fVar122;
      auVar59._4_4_ = fVar136 * fVar123;
      auVar59._8_4_ = fVar97 * fVar134;
      auVar59._12_4_ = fVar98 * fVar135;
      auVar59 = vsubps_avx(auVar59,auVar141);
      local_1a98 = auVar18._0_4_;
      fStack_1a94 = auVar18._4_4_;
      fStack_1a90 = auVar18._8_4_;
      auVar60._0_4_ = fVar223 * auVar50._0_4_ + auVar59._0_4_ * local_1a98 + fVar206 * auVar71._0_4_
      ;
      auVar60._4_4_ =
           fVar224 * auVar50._4_4_ + auVar59._4_4_ * fStack_1a94 + fVar209 * auVar71._4_4_;
      auVar60._8_4_ = fVar230 * auVar50._8_4_ + auVar59._8_4_ * fStack_1a90 + fVar99 * auVar71._8_4_
      ;
      auVar60._12_4_ =
           fVar104 * auVar50._12_4_ + auVar59._12_4_ * fVar203 + fVar101 * auVar71._12_4_;
      auVar125._0_4_ = auVar60._0_4_ + auVar220._0_4_ + auVar212._0_4_;
      auVar125._4_4_ = auVar60._4_4_ + auVar220._4_4_ + auVar212._4_4_;
      auVar125._8_4_ = auVar60._8_4_ + auVar220._8_4_ + auVar212._8_4_;
      auVar125._12_4_ = auVar60._12_4_ + auVar220._12_4_ + auVar212._12_4_;
      auVar50 = vminps_avx(auVar220,auVar212);
      auVar71 = vminps_avx(auVar50,auVar60);
      auVar142._8_4_ = 0x7fffffff;
      auVar142._0_8_ = 0x7fffffff7fffffff;
      auVar142._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar125,auVar142);
      auVar143._0_4_ = auVar50._0_4_ * 1.1920929e-07;
      auVar143._4_4_ = auVar50._4_4_ * 1.1920929e-07;
      auVar143._8_4_ = auVar50._8_4_ * 1.1920929e-07;
      auVar143._12_4_ = auVar50._12_4_ * 1.1920929e-07;
      uVar12 = CONCAT44(auVar143._4_4_,auVar143._0_4_);
      auVar156._0_8_ = uVar12 ^ 0x8000000080000000;
      auVar156._8_4_ = -auVar143._8_4_;
      auVar156._12_4_ = -auVar143._12_4_;
      auVar71 = vcmpps_avx(auVar71,auVar156,5);
      auVar59 = vmaxps_avx(auVar220,auVar212);
      auVar59 = vmaxps_avx(auVar59,auVar60);
      auVar59 = vcmpps_avx(auVar59,auVar143,2);
      auVar71 = vorps_avx(auVar71,auVar59);
      auVar59 = local_1a78 & auVar71;
      if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf])
      {
        auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
LAB_00325ff0:
        auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        auVar50 = vpcmpeqd_avx(auVar86,auVar86);
        auVar225 = ZEXT1664(auVar50);
      }
      else {
        auVar61._0_4_ = fVar208 * fVar35;
        auVar61._4_4_ = fVar210 * fVar55;
        auVar61._8_4_ = fVar217 * fVar174;
        auVar61._12_4_ = fVar222 * fVar204;
        auVar75._0_4_ = fVar52 * fVar162;
        auVar75._4_4_ = fVar163 * fVar170;
        auVar75._8_4_ = fVar178 * fVar173;
        auVar75._12_4_ = fVar207 * fVar177;
        auVar152 = vsubps_avx(auVar75,auVar61);
        auVar144._0_4_ = fVar194 * fVar162;
        auVar144._4_4_ = fVar102 * fVar170;
        auVar144._8_4_ = fVar120 * fVar173;
        auVar144._12_4_ = fVar121 * fVar177;
        auVar157._0_4_ = fVar208 * fVar176;
        auVar157._4_4_ = fVar210 * fVar179;
        auVar157._8_4_ = fVar217 * fVar195;
        auVar157._12_4_ = fVar222 * fVar205;
        auVar153 = vsubps_avx(auVar157,auVar144);
        auVar186._8_4_ = 0x7fffffff;
        auVar186._0_8_ = 0x7fffffff7fffffff;
        auVar186._12_4_ = 0x7fffffff;
        auVar59 = vandps_avx(auVar186,auVar61);
        auVar78 = vandps_avx(auVar186,auVar144);
        auVar59 = vcmpps_avx(auVar59,auVar78,1);
        auVar152 = vblendvps_avx(auVar153,auVar152,auVar59);
        auVar62._0_4_ = fVar231 * fVar176;
        auVar62._4_4_ = fVar233 * fVar179;
        auVar62._8_4_ = fVar234 * fVar195;
        auVar62._12_4_ = fVar235 * fVar205;
        auVar76._0_4_ = fVar231 * fVar35;
        auVar76._4_4_ = fVar233 * fVar55;
        auVar76._8_4_ = fVar234 * fVar174;
        auVar76._12_4_ = fVar235 * fVar204;
        auVar145._0_4_ = fVar164 * fVar162;
        auVar145._4_4_ = fVar171 * fVar170;
        auVar145._8_4_ = fVar172 * fVar173;
        auVar145._12_4_ = fVar175 * fVar177;
        auVar153 = vsubps_avx(auVar76,auVar145);
        auVar158._0_4_ = fVar124 * fVar162;
        auVar158._4_4_ = fVar136 * fVar170;
        auVar158._8_4_ = fVar97 * fVar173;
        auVar158._12_4_ = fVar98 * fVar177;
        auVar87 = vsubps_avx(auVar158,auVar62);
        auVar59 = vandps_avx(auVar186,auVar145);
        auVar78 = vandps_avx(auVar186,auVar62);
        auVar59 = vcmpps_avx(auVar59,auVar78,1);
        auVar153 = vblendvps_avx(auVar87,auVar153,auVar59);
        auVar63._0_4_ = fVar208 * fVar124;
        auVar63._4_4_ = fVar210 * fVar136;
        auVar63._8_4_ = fVar217 * fVar97;
        auVar63._12_4_ = fVar222 * fVar98;
        auVar77._0_4_ = fVar164 * fVar208;
        auVar77._4_4_ = fVar171 * fVar210;
        auVar77._8_4_ = fVar172 * fVar217;
        auVar77._12_4_ = fVar175 * fVar222;
        auVar108._0_4_ = fVar231 * fVar52;
        auVar108._4_4_ = fVar233 * fVar163;
        auVar108._8_4_ = fVar234 * fVar178;
        auVar108._12_4_ = fVar235 * fVar207;
        auVar44._0_4_ = fVar231 * fVar194;
        auVar44._4_4_ = fVar233 * fVar102;
        auVar44._8_4_ = fVar234 * fVar120;
        auVar44._12_4_ = fVar235 * fVar121;
        auVar87 = vsubps_avx(auVar77,auVar108);
        auVar79 = vsubps_avx(auVar44,auVar63);
        auVar59 = vandps_avx(auVar186,auVar108);
        auVar78 = vandps_avx(auVar186,auVar63);
        auVar59 = vcmpps_avx(auVar59,auVar78,1);
        auVar87 = vblendvps_avx(auVar79,auVar87,auVar59);
        local_1a48 = auVar20._0_4_;
        fStack_1a44 = auVar20._4_4_;
        fStack_1a40 = auVar20._8_4_;
        fVar35 = fVar223 * auVar152._0_4_ + auVar87._0_4_ * local_1a98 + auVar153._0_4_ * local_1a48
        ;
        fVar52 = fVar224 * auVar152._4_4_ +
                 auVar87._4_4_ * fStack_1a94 + auVar153._4_4_ * fStack_1a44;
        fVar162 = fVar230 * auVar152._8_4_ +
                  auVar87._8_4_ * fStack_1a90 + auVar153._8_4_ * fStack_1a40;
        fVar55 = fVar104 * auVar152._12_4_ + auVar87._12_4_ * fVar203 + auVar153._12_4_ * fVar101;
        auVar64._0_4_ = fVar35 + fVar35;
        auVar64._4_4_ = fVar52 + fVar52;
        auVar64._8_4_ = fVar162 + fVar162;
        auVar64._12_4_ = fVar55 + fVar55;
        fVar35 = auVar152._0_4_ * fVar180 + auVar87._0_4_ * fVar7 + auVar153._0_4_ * fVar6;
        fVar53 = auVar152._4_4_ * fVar187 + auVar87._4_4_ * fVar53 + auVar153._4_4_ * fVar8;
        fVar187 = auVar152._8_4_ * fVar188 + auVar87._8_4_ * fVar9 + auVar153._8_4_ * fVar56;
        fVar56 = auVar152._12_4_ * fVar189 + auVar87._12_4_ * fVar54 + auVar153._12_4_ * fVar103;
        auVar59 = vrcpps_avx(auVar64);
        fVar6 = auVar59._0_4_;
        auVar109._0_4_ = auVar64._0_4_ * fVar6;
        fVar7 = auVar59._4_4_;
        auVar109._4_4_ = auVar64._4_4_ * fVar7;
        fVar180 = auVar59._8_4_;
        auVar109._8_4_ = auVar64._8_4_ * fVar180;
        fVar8 = auVar59._12_4_;
        auVar109._12_4_ = auVar64._12_4_ * fVar8;
        auVar126._8_4_ = 0x3f800000;
        auVar126._0_8_ = &DAT_3f8000003f800000;
        auVar126._12_4_ = 0x3f800000;
        auVar59 = vsubps_avx(auVar126,auVar109);
        auVar45._0_4_ = (fVar35 + fVar35) * (fVar6 + fVar6 * auVar59._0_4_);
        auVar45._4_4_ = (fVar53 + fVar53) * (fVar7 + fVar7 * auVar59._4_4_);
        auVar45._8_4_ = (fVar187 + fVar187) * (fVar180 + fVar180 * auVar59._8_4_);
        auVar45._12_4_ = (fVar56 + fVar56) * (fVar8 + fVar8 * auVar59._12_4_);
        auVar59 = *(undefined1 (*) [16])(ray + 0x80);
        auVar78 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar45,2);
        auVar79 = vcmpps_avx(auVar45,auVar59,2);
        auVar78 = vandps_avx(auVar78,auVar79);
        auVar228 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar79 = vcmpps_avx(ZEXT816(0) << 0x20,auVar64,4);
        auVar78 = vandps_avx(auVar79,auVar78);
        auVar71 = vandps_avx(auVar71,local_1a78);
        auVar78 = vpslld_avx(auVar78,0x1f);
        auVar79 = vpsrad_avx(auVar78,0x1f);
        auVar78 = auVar71 & auVar79;
        auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar78 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar78 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar78[0xf]
           ) goto LAB_00325ff0;
        auVar71 = vandps_avx(auVar79,auVar71);
        pGVar4 = (context->scene->geometries).items[uVar23].ptr;
        uVar3 = pGVar4->mask;
        auVar80._4_4_ = uVar3;
        auVar80._0_4_ = uVar3;
        auVar80._8_4_ = uVar3;
        auVar80._12_4_ = uVar3;
        auVar78 = vandps_avx(auVar80,*(undefined1 (*) [16])(ray + 0x90));
        auVar78 = vpcmpeqd_avx(ZEXT816(0) << 0x20,auVar78);
        auVar79 = auVar71 & ~auVar78;
        auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        auVar86 = vpcmpeqd_avx(auVar86,auVar86);
        auVar225 = ZEXT1664(auVar86);
        if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar79[0xf] < '\0') {
          auVar71 = vandnps_avx(auVar78,auVar71);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar78 = vrcpps_avx(auVar125);
            fVar6 = auVar78._0_4_;
            auVar114._0_4_ = auVar125._0_4_ * fVar6;
            fVar7 = auVar78._4_4_;
            auVar114._4_4_ = auVar125._4_4_ * fVar7;
            fVar180 = auVar78._8_4_;
            auVar114._8_4_ = auVar125._8_4_ * fVar180;
            fVar8 = auVar78._12_4_;
            auVar114._12_4_ = auVar125._12_4_ * fVar8;
            auVar169._8_4_ = 0x3f800000;
            auVar169._0_8_ = &DAT_3f8000003f800000;
            auVar169._12_4_ = 0x3f800000;
            auVar78 = vsubps_avx(auVar169,auVar114);
            auVar89._0_4_ = fVar6 + fVar6 * auVar78._0_4_;
            auVar89._4_4_ = fVar7 + fVar7 * auVar78._4_4_;
            auVar89._8_4_ = fVar180 + fVar180 * auVar78._8_4_;
            auVar89._12_4_ = fVar8 + fVar8 * auVar78._12_4_;
            auVar115._8_4_ = 0x219392ef;
            auVar115._0_8_ = 0x219392ef219392ef;
            auVar115._12_4_ = 0x219392ef;
            auVar50 = vcmpps_avx(auVar50,auVar115,5);
            auVar50 = vandps_avx(auVar50,auVar89);
            auVar116._0_4_ = auVar50._0_4_ * auVar220._0_4_;
            auVar116._4_4_ = auVar50._4_4_ * auVar220._4_4_;
            auVar116._8_4_ = auVar50._8_4_ * auVar220._8_4_;
            auVar116._12_4_ = auVar50._12_4_ * auVar220._12_4_;
            auVar78 = vminps_avx(auVar116,auVar169);
            auVar90._0_4_ = auVar50._0_4_ * auVar212._0_4_;
            auVar90._4_4_ = auVar50._4_4_ * auVar212._4_4_;
            auVar90._8_4_ = auVar50._8_4_ * auVar212._8_4_;
            auVar90._12_4_ = auVar50._12_4_ * auVar212._12_4_;
            auVar50 = vminps_avx(auVar90,auVar169);
            auVar79 = vsubps_avx(auVar169,auVar78);
            auVar211 = vsubps_avx(auVar169,auVar50);
            auVar17._8_8_ = uVar22;
            auVar17._0_8_ = uVar21;
            local_1898 = vblendvps_avx(auVar78,auVar79,auVar17);
            local_1888 = vblendvps_avx(auVar50,auVar211,auVar17);
            local_1868 = vpshufd_avx(ZEXT416(uVar23),0);
            local_1878 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_18d8 + uVar31 * 4)),0);
            local_18c8[0] = (RTCHitN)auVar152[0];
            local_18c8[1] = (RTCHitN)auVar152[1];
            local_18c8[2] = (RTCHitN)auVar152[2];
            local_18c8[3] = (RTCHitN)auVar152[3];
            local_18c8[4] = (RTCHitN)auVar152[4];
            local_18c8[5] = (RTCHitN)auVar152[5];
            local_18c8[6] = (RTCHitN)auVar152[6];
            local_18c8[7] = (RTCHitN)auVar152[7];
            local_18c8[8] = (RTCHitN)auVar152[8];
            local_18c8[9] = (RTCHitN)auVar152[9];
            local_18c8[10] = (RTCHitN)auVar152[10];
            local_18c8[0xb] = (RTCHitN)auVar152[0xb];
            local_18c8[0xc] = (RTCHitN)auVar152[0xc];
            local_18c8[0xd] = (RTCHitN)auVar152[0xd];
            local_18c8[0xe] = (RTCHitN)auVar152[0xe];
            local_18c8[0xf] = (RTCHitN)auVar152[0xf];
            local_18b8 = auVar153;
            local_18a8 = auVar87;
            vcmpps_avx(ZEXT1632(local_1888),ZEXT1632(local_1888),0xf);
            uStack_1854 = context->user->instID[0];
            local_1858 = uStack_1854;
            uStack_1850 = uStack_1854;
            uStack_184c = uStack_1854;
            uStack_1848 = context->user->instPrimID[0];
            uStack_1844 = uStack_1848;
            uStack_1840 = uStack_1848;
            uStack_183c = uStack_1848;
            auVar50 = vblendvps_avx(auVar59,auVar45,auVar71);
            *(undefined1 (*) [16])(ray + 0x80) = auVar50;
            args.valid = (int *)local_1a38;
            args.geometryUserPtr = pGVar4->userPtr;
            args.context = context->user;
            args.hit = local_18c8;
            args.N = 4;
            local_1a38 = auVar71;
            args.ray = (RTCRayN *)ray;
            if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar4->occlusionFilterN)(&args);
              auVar228 = ZEXT816(0) << 0x40;
              auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            if (local_1a38 == (undefined1  [16])0x0) {
              auVar50 = vpcmpeqd_avx(auVar228,(undefined1  [16])0x0);
              auVar71 = vpcmpeqd_avx(auVar86,auVar86);
              auVar225 = ZEXT1664(auVar71);
              auVar71 = auVar71 ^ auVar50;
            }
            else {
              p_Var5 = context->args->filter;
              auVar50 = vpcmpeqd_avx(auVar86,auVar86);
              auVar225 = ZEXT1664(auVar50);
              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var5)(&args);
                auVar228 = ZEXT816(0) << 0x40;
                auVar50 = vpcmpeqd_avx(auVar50,auVar50);
                auVar225 = ZEXT1664(auVar50);
                auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              auVar50 = vpcmpeqd_avx(auVar228,local_1a38);
              auVar71 = auVar225._0_16_ ^ auVar50;
              auVar91._8_4_ = 0xff800000;
              auVar91._0_8_ = 0xff800000ff800000;
              auVar91._12_4_ = 0xff800000;
              auVar50 = vblendvps_avx(auVar91,*(undefined1 (*) [16])(args.ray + 0x80),auVar50);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
            }
            auVar50 = vpslld_avx(auVar71,0x1f);
            auVar71 = vpsrad_avx(auVar50,0x1f);
            auVar50 = vblendvps_avx(auVar59,*(undefined1 (*) [16])pRVar1,auVar50);
            *(undefined1 (*) [16])pRVar1 = auVar50;
          }
          local_1a78 = vpandn_avx(auVar71,local_1a78);
        }
      }
      if ((((local_1a78 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_1a78 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_1a78 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_1a78[0xf]) {
        bVar34 = false;
      }
      else {
        auVar50 = *(undefined1 (*) [16])ray;
        auVar71 = *(undefined1 (*) [16])(ray + 0x10);
        auVar59 = *(undefined1 (*) [16])(ray + 0x20);
        auVar86 = vsubps_avx(local_1978,auVar50);
        auVar78 = vsubps_avx(local_1988,auVar71);
        auVar152 = vsubps_avx(local_1998,auVar59);
        auVar153 = vsubps_avx(auVar218,auVar50);
        auVar87 = vsubps_avx(auVar139,auVar71);
        auVar79 = vsubps_avx(auVar166,auVar59);
        auVar13._4_4_ = uVar27;
        auVar13._0_4_ = uVar27;
        auVar13._8_4_ = uVar27;
        auVar13._12_4_ = uVar27;
        auVar50 = vsubps_avx(auVar13,auVar50);
        auVar71 = vsubps_avx(local_19c8,auVar71);
        auVar59 = vsubps_avx(local_19d8,auVar59);
        auVar228 = vsubps_avx(auVar50,auVar86);
        auVar211 = vsubps_avx(auVar71,auVar78);
        auVar11 = vsubps_avx(auVar59,auVar152);
        fVar6 = auVar78._0_4_;
        fVar103 = auVar71._0_4_ + fVar6;
        fVar180 = auVar78._4_4_;
        fVar189 = auVar71._4_4_ + fVar180;
        fVar53 = auVar78._8_4_;
        fVar52 = auVar71._8_4_ + fVar53;
        fVar56 = auVar78._12_4_;
        fVar55 = auVar71._12_4_ + fVar56;
        fVar230 = auVar152._0_4_;
        fVar163 = fVar230 + auVar59._0_4_;
        fVar233 = auVar152._4_4_;
        fVar170 = fVar233 + auVar59._4_4_;
        fVar235 = auVar152._8_4_;
        fVar174 = fVar235 + auVar59._8_4_;
        fVar237 = auVar152._12_4_;
        fVar178 = fVar237 + auVar59._12_4_;
        fVar188 = auVar11._0_4_;
        auVar199._0_4_ = fVar103 * fVar188;
        fVar54 = auVar11._4_4_;
        auVar199._4_4_ = fVar189 * fVar54;
        fVar35 = auVar11._8_4_;
        auVar199._8_4_ = fVar52 * fVar35;
        fVar162 = auVar11._12_4_;
        auVar199._12_4_ = fVar55 * fVar162;
        fVar217 = auVar211._0_4_;
        auVar213._0_4_ = fVar217 * fVar163;
        fVar222 = auVar211._4_4_;
        auVar213._4_4_ = fVar222 * fVar170;
        fVar223 = auVar211._8_4_;
        auVar213._8_4_ = fVar223 * fVar174;
        fVar224 = auVar211._12_4_;
        auVar213._12_4_ = fVar224 * fVar178;
        auVar211 = vsubps_avx(auVar213,auVar199);
        fVar7 = auVar86._0_4_;
        fVar173 = auVar50._0_4_ + fVar7;
        fVar8 = auVar86._4_4_;
        fVar204 = auVar50._4_4_ + fVar8;
        fVar187 = auVar86._8_4_;
        fVar207 = auVar50._8_4_ + fVar187;
        fVar9 = auVar86._12_4_;
        fVar177 = auVar50._12_4_ + fVar9;
        fVar121 = auVar228._0_4_;
        auVar168._0_4_ = fVar121 * fVar163;
        fVar123 = auVar228._4_4_;
        auVar168._4_4_ = fVar123 * fVar170;
        fVar135 = auVar228._8_4_;
        auVar168._8_4_ = fVar135 * fVar174;
        fVar97 = auVar228._12_4_;
        auVar168._12_4_ = fVar97 * fVar178;
        auVar214._0_4_ = fVar173 * fVar188;
        auVar214._4_4_ = fVar204 * fVar54;
        auVar214._8_4_ = fVar207 * fVar35;
        auVar214._12_4_ = fVar177 * fVar162;
        auVar228 = vsubps_avx(auVar214,auVar168);
        auVar200._0_4_ = fVar173 * fVar217;
        auVar200._4_4_ = fVar204 * fVar222;
        auVar200._8_4_ = fVar207 * fVar223;
        auVar200._12_4_ = fVar177 * fVar224;
        auVar110._0_4_ = fVar121 * fVar103;
        auVar110._4_4_ = fVar123 * fVar189;
        auVar110._8_4_ = fVar135 * fVar52;
        auVar110._12_4_ = fVar97 * fVar55;
        auVar11 = vsubps_avx(auVar110,auVar200);
        fVar163 = *(float *)(ray + 0x60);
        fVar170 = *(float *)(ray + 100);
        fVar174 = *(float *)(ray + 0x68);
        auVar19 = *(undefined1 (*) [12])(ray + 0x60);
        fVar178 = *(float *)(ray + 0x6c);
        auVar18 = *(undefined1 (*) [12])(ray + 0x50);
        fVar173 = *(float *)(ray + 0x5c);
        fVar204 = *(float *)(ray + 0x40);
        fVar207 = *(float *)(ray + 0x44);
        fVar177 = *(float *)(ray + 0x48);
        auVar20 = *(undefined1 (*) [12])(ray + 0x40);
        fVar194 = *(float *)(ray + 0x4c);
        auVar215._0_4_ =
             fVar204 * auVar211._0_4_ +
             fVar163 * auVar11._0_4_ + *(float *)(ray + 0x50) * auVar228._0_4_;
        auVar215._4_4_ =
             fVar207 * auVar211._4_4_ +
             fVar170 * auVar11._4_4_ + *(float *)(ray + 0x54) * auVar228._4_4_;
        auVar215._8_4_ =
             fVar177 * auVar211._8_4_ +
             fVar174 * auVar11._8_4_ + *(float *)(ray + 0x58) * auVar228._8_4_;
        auVar215._12_4_ =
             fVar194 * auVar211._12_4_ + fVar178 * auVar11._12_4_ + fVar173 * auVar228._12_4_;
        auVar78 = vsubps_avx(auVar78,auVar87);
        auVar152 = vsubps_avx(auVar152,auVar79);
        fVar104 = fVar6 + auVar87._0_4_;
        fVar102 = fVar180 + auVar87._4_4_;
        fVar120 = fVar53 + auVar87._8_4_;
        fVar122 = fVar56 + auVar87._12_4_;
        fVar206 = fVar230 + auVar79._0_4_;
        fVar209 = fVar233 + auVar79._4_4_;
        fVar99 = fVar235 + auVar79._8_4_;
        fVar101 = fVar237 + auVar79._12_4_;
        fVar103 = auVar152._0_4_;
        auVar232._0_4_ = fVar104 * fVar103;
        fVar189 = auVar152._4_4_;
        auVar232._4_4_ = fVar102 * fVar189;
        fVar52 = auVar152._8_4_;
        auVar232._8_4_ = fVar120 * fVar52;
        fVar55 = auVar152._12_4_;
        auVar232._12_4_ = fVar122 * fVar55;
        fVar151 = auVar78._0_4_;
        auVar127._0_4_ = fVar151 * fVar206;
        fVar171 = auVar78._4_4_;
        auVar127._4_4_ = fVar171 * fVar209;
        fVar175 = auVar78._8_4_;
        auVar127._8_4_ = fVar175 * fVar99;
        fVar179 = auVar78._12_4_;
        auVar127._12_4_ = fVar179 * fVar101;
        auVar78 = vsubps_avx(auVar127,auVar232);
        auVar86 = vsubps_avx(auVar86,auVar153);
        fVar203 = auVar86._0_4_;
        auVar81._0_4_ = fVar203 * fVar206;
        fVar206 = auVar86._4_4_;
        auVar81._4_4_ = fVar206 * fVar209;
        fVar209 = auVar86._8_4_;
        auVar81._8_4_ = fVar209 * fVar99;
        fVar99 = auVar86._12_4_;
        auVar81._12_4_ = fVar99 * fVar101;
        fVar101 = fVar7 + auVar153._0_4_;
        fVar134 = fVar8 + auVar153._4_4_;
        fVar136 = fVar187 + auVar153._8_4_;
        fVar98 = fVar9 + auVar153._12_4_;
        auVar201._0_4_ = fVar101 * fVar103;
        auVar201._4_4_ = fVar134 * fVar189;
        auVar201._8_4_ = fVar136 * fVar52;
        auVar201._12_4_ = fVar98 * fVar55;
        auVar86 = vsubps_avx(auVar201,auVar81);
        auVar192._0_4_ = fVar101 * fVar151;
        auVar192._4_4_ = fVar134 * fVar171;
        auVar192._8_4_ = fVar136 * fVar175;
        auVar192._12_4_ = fVar98 * fVar179;
        auVar111._0_4_ = fVar203 * fVar104;
        auVar111._4_4_ = fVar206 * fVar102;
        auVar111._8_4_ = fVar209 * fVar120;
        auVar111._12_4_ = fVar99 * fVar122;
        auVar152 = vsubps_avx(auVar111,auVar192);
        fVar164 = auVar18._0_4_;
        fVar172 = auVar18._4_4_;
        fVar176 = auVar18._8_4_;
        auVar193._0_4_ =
             fVar204 * auVar78._0_4_ + fVar163 * auVar152._0_4_ + fVar164 * auVar86._0_4_;
        auVar193._4_4_ =
             fVar207 * auVar78._4_4_ + fVar170 * auVar152._4_4_ + fVar172 * auVar86._4_4_;
        auVar193._8_4_ =
             fVar177 * auVar78._8_4_ + fVar174 * auVar152._8_4_ + fVar176 * auVar86._8_4_;
        auVar193._12_4_ =
             fVar194 * auVar78._12_4_ + fVar178 * auVar152._12_4_ + fVar173 * auVar86._12_4_;
        auVar86 = vsubps_avx(auVar153,auVar50);
        fVar101 = auVar153._0_4_ + auVar50._0_4_;
        fVar104 = auVar153._4_4_ + auVar50._4_4_;
        fVar102 = auVar153._8_4_ + auVar50._8_4_;
        fVar120 = auVar153._12_4_ + auVar50._12_4_;
        auVar50 = vsubps_avx(auVar87,auVar71);
        fVar122 = auVar87._0_4_ + auVar71._0_4_;
        fVar134 = auVar87._4_4_ + auVar71._4_4_;
        fVar136 = auVar87._8_4_ + auVar71._8_4_;
        fVar98 = auVar87._12_4_ + auVar71._12_4_;
        auVar71 = vsubps_avx(auVar79,auVar59);
        fVar124 = auVar79._0_4_ + auVar59._0_4_;
        fVar137 = auVar79._4_4_ + auVar59._4_4_;
        fVar149 = auVar79._8_4_ + auVar59._8_4_;
        fVar150 = auVar79._12_4_ + auVar59._12_4_;
        fVar195 = auVar71._0_4_;
        auVar46._0_4_ = fVar195 * fVar122;
        fVar205 = auVar71._4_4_;
        auVar46._4_4_ = fVar205 * fVar134;
        fVar208 = auVar71._8_4_;
        auVar46._8_4_ = fVar208 * fVar136;
        fVar210 = auVar71._12_4_;
        auVar46._12_4_ = fVar210 * fVar98;
        fVar231 = auVar50._0_4_;
        auVar159._0_4_ = fVar231 * fVar124;
        fVar234 = auVar50._4_4_;
        auVar159._4_4_ = fVar234 * fVar137;
        fVar236 = auVar50._8_4_;
        auVar159._8_4_ = fVar236 * fVar149;
        fVar238 = auVar50._12_4_;
        auVar159._12_4_ = fVar238 * fVar150;
        auVar50 = vsubps_avx(auVar159,auVar46);
        fVar100 = auVar86._0_4_;
        auVar128._0_4_ = fVar100 * fVar124;
        fVar124 = auVar86._4_4_;
        auVar128._4_4_ = fVar124 * fVar137;
        fVar137 = auVar86._8_4_;
        auVar128._8_4_ = fVar137 * fVar149;
        fVar149 = auVar86._12_4_;
        auVar128._12_4_ = fVar149 * fVar150;
        auVar160._0_4_ = fVar195 * fVar101;
        auVar160._4_4_ = fVar205 * fVar104;
        auVar160._8_4_ = fVar208 * fVar102;
        auVar160._12_4_ = fVar210 * fVar120;
        auVar71 = vsubps_avx(auVar160,auVar128);
        auVar65._0_4_ = fVar231 * fVar101;
        auVar65._4_4_ = fVar234 * fVar104;
        auVar65._8_4_ = fVar236 * fVar102;
        auVar65._12_4_ = fVar238 * fVar120;
        auVar82._0_4_ = fVar100 * fVar122;
        auVar82._4_4_ = fVar124 * fVar134;
        auVar82._8_4_ = fVar137 * fVar136;
        auVar82._12_4_ = fVar149 * fVar98;
        auVar59 = vsubps_avx(auVar82,auVar65);
        auVar66._0_4_ = fVar204 * auVar50._0_4_ + fVar163 * auVar59._0_4_ + fVar164 * auVar71._0_4_;
        auVar66._4_4_ = fVar207 * auVar50._4_4_ + fVar170 * auVar59._4_4_ + fVar172 * auVar71._4_4_;
        auVar66._8_4_ = fVar177 * auVar50._8_4_ + fVar174 * auVar59._8_4_ + fVar176 * auVar71._8_4_;
        auVar66._12_4_ =
             fVar194 * auVar50._12_4_ + fVar178 * auVar59._12_4_ + fVar173 * auVar71._12_4_;
        auVar129._0_4_ = auVar66._0_4_ + auVar215._0_4_ + auVar193._0_4_;
        auVar129._4_4_ = auVar66._4_4_ + auVar215._4_4_ + auVar193._4_4_;
        auVar129._8_4_ = auVar66._8_4_ + auVar215._8_4_ + auVar193._8_4_;
        auVar129._12_4_ = auVar66._12_4_ + auVar215._12_4_ + auVar193._12_4_;
        auVar50 = vminps_avx(auVar215,auVar193);
        auVar71 = vminps_avx(auVar50,auVar66);
        auVar47._8_4_ = 0x7fffffff;
        auVar47._0_8_ = 0x7fffffff7fffffff;
        auVar47._12_4_ = 0x7fffffff;
        auVar50 = vandps_avx(auVar129,auVar47);
        auVar130._0_4_ = auVar50._0_4_ * 1.1920929e-07;
        auVar130._4_4_ = auVar50._4_4_ * 1.1920929e-07;
        auVar130._8_4_ = auVar50._8_4_ * 1.1920929e-07;
        auVar130._12_4_ = auVar50._12_4_ * 1.1920929e-07;
        uVar12 = CONCAT44(auVar130._4_4_,auVar130._0_4_);
        auVar146._0_8_ = uVar12 ^ 0x8000000080000000;
        auVar146._8_4_ = -auVar130._8_4_;
        auVar146._12_4_ = -auVar130._12_4_;
        auVar71 = vcmpps_avx(auVar71,auVar146,5);
        auVar59 = vmaxps_avx(auVar215,auVar193);
        auVar59 = vmaxps_avx(auVar59,auVar66);
        auVar59 = vcmpps_avx(auVar59,auVar130,2);
        auVar71 = vorps_avx(auVar71,auVar59);
        auVar59 = local_1a78 & auVar71;
        if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf]
           ) {
LAB_00325d2e:
          auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_00325d49:
          auVar50 = vpcmpeqd_avx(auVar47,auVar47);
          auVar225 = ZEXT1664(auVar50);
        }
        else {
          auVar67._0_4_ = fVar188 * fVar151;
          auVar67._4_4_ = fVar54 * fVar171;
          auVar67._8_4_ = fVar35 * fVar175;
          auVar67._12_4_ = fVar162 * fVar179;
          auVar83._0_4_ = fVar217 * fVar103;
          auVar83._4_4_ = fVar222 * fVar189;
          auVar83._8_4_ = fVar223 * fVar52;
          auVar83._12_4_ = fVar224 * fVar55;
          auVar78 = vsubps_avx(auVar83,auVar67);
          auVar131._0_4_ = fVar231 * fVar103;
          auVar131._4_4_ = fVar234 * fVar189;
          auVar131._8_4_ = fVar236 * fVar52;
          auVar131._12_4_ = fVar238 * fVar55;
          auVar147._0_4_ = fVar195 * fVar151;
          auVar147._4_4_ = fVar205 * fVar171;
          auVar147._8_4_ = fVar208 * fVar175;
          auVar147._12_4_ = fVar210 * fVar179;
          auVar152 = vsubps_avx(auVar147,auVar131);
          auVar59 = vandps_avx(auVar47,auVar67);
          auVar86 = vandps_avx(auVar47,auVar131);
          auVar59 = vcmpps_avx(auVar59,auVar86,1);
          auVar78 = vblendvps_avx(auVar152,auVar78,auVar59);
          auVar68._0_4_ = fVar203 * fVar195;
          auVar68._4_4_ = fVar206 * fVar205;
          auVar68._8_4_ = fVar209 * fVar208;
          auVar68._12_4_ = fVar99 * fVar210;
          auVar84._0_4_ = fVar203 * fVar188;
          auVar84._4_4_ = fVar206 * fVar54;
          auVar84._8_4_ = fVar209 * fVar35;
          auVar84._12_4_ = fVar99 * fVar162;
          auVar132._0_4_ = fVar121 * fVar103;
          auVar132._4_4_ = fVar123 * fVar189;
          auVar132._8_4_ = fVar135 * fVar52;
          auVar132._12_4_ = fVar97 * fVar55;
          auVar152 = vsubps_avx(auVar84,auVar132);
          auVar148._0_4_ = fVar103 * fVar100;
          auVar148._4_4_ = fVar189 * fVar124;
          auVar148._8_4_ = fVar52 * fVar137;
          auVar148._12_4_ = fVar55 * fVar149;
          auVar153 = vsubps_avx(auVar148,auVar68);
          auVar59 = vandps_avx(auVar47,auVar132);
          auVar86 = vandps_avx(auVar47,auVar68);
          auVar59 = vcmpps_avx(auVar59,auVar86,1);
          auVar152 = vblendvps_avx(auVar153,auVar152,auVar59);
          auVar69._0_4_ = fVar100 * fVar151;
          auVar69._4_4_ = fVar124 * fVar171;
          auVar69._8_4_ = fVar137 * fVar175;
          auVar69._12_4_ = fVar149 * fVar179;
          auVar85._0_4_ = fVar121 * fVar151;
          auVar85._4_4_ = fVar123 * fVar171;
          auVar85._8_4_ = fVar135 * fVar175;
          auVar85._12_4_ = fVar97 * fVar179;
          auVar112._0_4_ = fVar203 * fVar217;
          auVar112._4_4_ = fVar206 * fVar222;
          auVar112._8_4_ = fVar209 * fVar223;
          auVar112._12_4_ = fVar99 * fVar224;
          auVar48._0_4_ = fVar203 * fVar231;
          auVar48._4_4_ = fVar206 * fVar234;
          auVar48._8_4_ = fVar209 * fVar236;
          auVar48._12_4_ = fVar99 * fVar238;
          auVar153 = vsubps_avx(auVar85,auVar112);
          auVar87 = vsubps_avx(auVar48,auVar69);
          auVar59 = vandps_avx(auVar47,auVar112);
          auVar86 = vandps_avx(auVar47,auVar69);
          auVar59 = vcmpps_avx(auVar59,auVar86,1);
          auVar153 = vblendvps_avx(auVar87,auVar153,auVar59);
          local_1a98 = auVar19._0_4_;
          fStack_1a94 = auVar19._4_4_;
          fStack_1a90 = auVar19._8_4_;
          local_1a48 = auVar20._0_4_;
          fStack_1a44 = auVar20._4_4_;
          fStack_1a40 = auVar20._8_4_;
          fVar188 = auVar78._0_4_ * local_1a48 +
                    auVar153._0_4_ * local_1a98 + fVar164 * auVar152._0_4_;
          fVar103 = auVar78._4_4_ * fStack_1a44 +
                    auVar153._4_4_ * fStack_1a94 + fVar172 * auVar152._4_4_;
          fVar54 = auVar78._8_4_ * fStack_1a40 +
                   auVar153._8_4_ * fStack_1a90 + fVar176 * auVar152._8_4_;
          fVar189 = auVar78._12_4_ * fVar194 + auVar153._12_4_ * fVar178 + fVar173 * auVar152._12_4_
          ;
          auVar70._0_4_ = fVar188 + fVar188;
          auVar70._4_4_ = fVar103 + fVar103;
          auVar70._8_4_ = fVar54 + fVar54;
          auVar70._12_4_ = fVar189 + fVar189;
          fVar188 = auVar78._0_4_ * fVar7 + auVar153._0_4_ * fVar230 + auVar152._0_4_ * fVar6;
          fVar103 = auVar78._4_4_ * fVar8 + auVar153._4_4_ * fVar233 + auVar152._4_4_ * fVar180;
          fVar53 = auVar78._8_4_ * fVar187 + auVar153._8_4_ * fVar235 + auVar152._8_4_ * fVar53;
          fVar187 = auVar78._12_4_ * fVar9 + auVar153._12_4_ * fVar237 + auVar152._12_4_ * fVar56;
          auVar59 = vrcpps_avx(auVar70);
          fVar6 = auVar59._0_4_;
          auVar113._0_4_ = auVar70._0_4_ * fVar6;
          fVar7 = auVar59._4_4_;
          auVar113._4_4_ = auVar70._4_4_ * fVar7;
          fVar180 = auVar59._8_4_;
          auVar113._8_4_ = auVar70._8_4_ * fVar180;
          fVar8 = auVar59._12_4_;
          auVar113._12_4_ = auVar70._12_4_ * fVar8;
          auVar133._8_4_ = 0x3f800000;
          auVar133._0_8_ = &DAT_3f8000003f800000;
          auVar133._12_4_ = 0x3f800000;
          auVar59 = vsubps_avx(auVar133,auVar113);
          auVar49._0_4_ = (fVar188 + fVar188) * (fVar6 + fVar6 * auVar59._0_4_);
          auVar49._4_4_ = (fVar103 + fVar103) * (fVar7 + fVar7 * auVar59._4_4_);
          auVar49._8_4_ = (fVar53 + fVar53) * (fVar180 + fVar180 * auVar59._8_4_);
          auVar49._12_4_ = (fVar187 + fVar187) * (fVar8 + fVar8 * auVar59._12_4_);
          auVar59 = *(undefined1 (*) [16])(ray + 0x80);
          auVar86 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar49,2);
          auVar87 = vcmpps_avx(auVar49,auVar59,2);
          auVar86 = vandps_avx(auVar86,auVar87);
          auVar79 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar87 = vcmpps_avx(ZEXT816(0) << 0x20,auVar70,4);
          auVar86 = vandps_avx(auVar87,auVar86);
          auVar71 = vandps_avx(local_1a78,auVar71);
          auVar86 = vpslld_avx(auVar86,0x1f);
          auVar87 = vpsrad_avx(auVar86,0x1f);
          auVar86 = auVar71 & auVar87;
          if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar86[0xf]) goto LAB_00325d2e;
          auVar71 = vandps_avx(auVar87,auVar71);
          uVar3 = *(uint *)(lVar28 + uVar31 * 4);
          pGVar4 = (context->scene->geometries).items[uVar3].ptr;
          uVar23 = pGVar4->mask;
          auVar88._4_4_ = uVar23;
          auVar88._0_4_ = uVar23;
          auVar88._8_4_ = uVar23;
          auVar88._12_4_ = uVar23;
          auVar86 = vandps_avx(auVar88,*(undefined1 (*) [16])(ray + 0x90));
          auVar86 = vpcmpeqd_avx(ZEXT816(0) << 0x20,auVar86);
          auVar87 = auVar71 & ~auVar86;
          auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar87 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar87 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar87[0xf]) goto LAB_00325d49;
          auVar71 = vandnps_avx(auVar86,auVar71);
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            auVar50 = vpcmpeqd_avx(auVar47,auVar47);
            auVar225 = ZEXT1664(auVar50);
          }
          else {
            auVar86 = vrcpps_avx(auVar129);
            fVar6 = auVar86._0_4_;
            auVar117._0_4_ = auVar129._0_4_ * fVar6;
            fVar7 = auVar86._4_4_;
            auVar117._4_4_ = auVar129._4_4_ * fVar7;
            fVar180 = auVar86._8_4_;
            auVar117._8_4_ = auVar129._8_4_ * fVar180;
            fVar8 = auVar86._12_4_;
            auVar117._12_4_ = auVar129._12_4_ * fVar8;
            auVar161._8_4_ = 0x3f800000;
            auVar161._0_8_ = &DAT_3f8000003f800000;
            auVar161._12_4_ = 0x3f800000;
            auVar86 = vsubps_avx(auVar161,auVar117);
            auVar92._0_4_ = fVar6 + fVar6 * auVar86._0_4_;
            auVar92._4_4_ = fVar7 + fVar7 * auVar86._4_4_;
            auVar92._8_4_ = fVar180 + fVar180 * auVar86._8_4_;
            auVar92._12_4_ = fVar8 + fVar8 * auVar86._12_4_;
            auVar118._8_4_ = 0x219392ef;
            auVar118._0_8_ = 0x219392ef219392ef;
            auVar118._12_4_ = 0x219392ef;
            auVar50 = vcmpps_avx(auVar50,auVar118,5);
            auVar50 = vandps_avx(auVar50,auVar92);
            auVar119._0_4_ = auVar50._0_4_ * auVar215._0_4_;
            auVar119._4_4_ = auVar50._4_4_ * auVar215._4_4_;
            auVar119._8_4_ = auVar50._8_4_ * auVar215._8_4_;
            auVar119._12_4_ = auVar50._12_4_ * auVar215._12_4_;
            auVar86 = vminps_avx(auVar119,auVar161);
            auVar93._0_4_ = auVar50._0_4_ * auVar193._0_4_;
            auVar93._4_4_ = auVar50._4_4_ * auVar193._4_4_;
            auVar93._8_4_ = auVar50._8_4_ * auVar193._8_4_;
            auVar93._12_4_ = auVar50._12_4_ * auVar193._12_4_;
            auVar50 = vminps_avx(auVar93,auVar161);
            auVar87 = vsubps_avx(auVar161,auVar86);
            auVar228 = vsubps_avx(auVar161,auVar50);
            local_1898 = vblendvps_avx(auVar86,auVar87,auVar10);
            local_1888 = vblendvps_avx(auVar50,auVar228,auVar10);
            local_1868 = vpshufd_avx(ZEXT416(uVar3),0);
            local_1878 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_18d8 + uVar31 * 4)),0);
            local_18c8[0] = (RTCHitN)auVar78[0];
            local_18c8[1] = (RTCHitN)auVar78[1];
            local_18c8[2] = (RTCHitN)auVar78[2];
            local_18c8[3] = (RTCHitN)auVar78[3];
            local_18c8[4] = (RTCHitN)auVar78[4];
            local_18c8[5] = (RTCHitN)auVar78[5];
            local_18c8[6] = (RTCHitN)auVar78[6];
            local_18c8[7] = (RTCHitN)auVar78[7];
            local_18c8[8] = (RTCHitN)auVar78[8];
            local_18c8[9] = (RTCHitN)auVar78[9];
            local_18c8[10] = (RTCHitN)auVar78[10];
            local_18c8[0xb] = (RTCHitN)auVar78[0xb];
            local_18c8[0xc] = (RTCHitN)auVar78[0xc];
            local_18c8[0xd] = (RTCHitN)auVar78[0xd];
            local_18c8[0xe] = (RTCHitN)auVar78[0xe];
            local_18c8[0xf] = (RTCHitN)auVar78[0xf];
            local_18b8 = auVar152;
            local_18a8 = auVar153;
            vcmpps_avx(ZEXT1632(local_1888),ZEXT1632(local_1888),0xf);
            uStack_1854 = context->user->instID[0];
            local_1858 = uStack_1854;
            uStack_1850 = uStack_1854;
            uStack_184c = uStack_1854;
            uStack_1848 = context->user->instPrimID[0];
            uStack_1844 = uStack_1848;
            uStack_1840 = uStack_1848;
            uStack_183c = uStack_1848;
            auVar50 = vblendvps_avx(auVar59,auVar49,auVar71);
            *(undefined1 (*) [16])(ray + 0x80) = auVar50;
            args.valid = (int *)local_1a38;
            args.geometryUserPtr = pGVar4->userPtr;
            args.context = context->user;
            args.hit = local_18c8;
            args.N = 4;
            local_1a38 = auVar71;
            args.ray = (RTCRayN *)ray;
            if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar4->occlusionFilterN)(&args);
              auVar79 = ZEXT816(0) << 0x40;
              auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            if (local_1a38 == (undefined1  [16])0x0) {
              auVar50 = vpcmpeqd_avx(auVar79,(undefined1  [16])0x0);
              auVar71 = vpcmpeqd_avx(auVar47,auVar47);
              auVar225 = ZEXT1664(auVar71);
              auVar71 = auVar71 ^ auVar50;
            }
            else {
              p_Var5 = context->args->filter;
              auVar50 = vpcmpeqd_avx(auVar47,auVar47);
              auVar225 = ZEXT1664(auVar50);
              if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var5)(&args);
                auVar79 = ZEXT816(0) << 0x40;
                auVar50 = vpcmpeqd_avx(auVar50,auVar50);
                auVar225 = ZEXT1664(auVar50);
                auVar221 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar202 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar216 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              auVar50 = vpcmpeqd_avx(auVar79,local_1a38);
              auVar71 = auVar225._0_16_ ^ auVar50;
              auVar94._8_4_ = 0xff800000;
              auVar94._0_8_ = 0xff800000ff800000;
              auVar94._12_4_ = 0xff800000;
              auVar50 = vblendvps_avx(auVar94,*(undefined1 (*) [16])(args.ray + 0x80),auVar50);
              *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
            }
            auVar50 = vpslld_avx(auVar71,0x1f);
            auVar71 = vpsrad_avx(auVar50,0x1f);
            auVar50 = vblendvps_avx(auVar59,*(undefined1 (*) [16])pRVar1,auVar50);
            *(undefined1 (*) [16])pRVar1 = auVar50;
          }
          local_1a78 = vpandn_avx(auVar71,local_1a78);
        }
        bVar34 = (((local_1a78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (local_1a78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (local_1a78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 local_1a78[0xf] < '\0';
      }
      if ((!bVar34) || (bVar34 = 2 < uVar31, uVar31 = uVar31 + 1, bVar34)) break;
    }
    auVar50 = vpand_avx(local_1a78,auVar96);
    auVar96 = auVar96 & local_1a78;
    if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar96 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar96 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar96[0xf])
    break;
  }
  aVar51 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar225._0_16_ ^ auVar50);
LAB_00326096:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])aVar51,(undefined1  [16])terminated.field_0);
  auVar96 = auVar225._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar96 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar96 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar96[0xf]) {
LAB_003260d9:
    iVar24 = 3;
  }
  else {
    auVar95._8_4_ = 0xff800000;
    auVar95._0_8_ = 0xff800000ff800000;
    auVar95._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar95,
                       (undefined1  [16])terminated.field_0);
    iVar24 = 0;
  }
LAB_003260dc:
  if (iVar24 == 3) {
    auVar10 = vandps_avx(auVar72,(undefined1  [16])terminated.field_0);
    auVar72._8_4_ = 0xff800000;
    auVar72._0_8_ = 0xff800000ff800000;
    auVar72._12_4_ = 0xff800000;
    auVar10 = vmaskmovps_avx(auVar10,auVar72);
    *(undefined1 (*) [16])pRVar1 = auVar10;
    return;
  }
  goto LAB_00324e1a;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }